

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O0

string * __thiscall
ot::commissioner::Error::ToString_abi_cxx11_(string *__return_storage_ptr__,Error *this)

{
  ErrorCode EVar1;
  ErrorCode code;
  ErrorCode code_00;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  undefined1 local_19;
  Error *local_18;
  Error *this_local;
  string *ret;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Error *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  EVar1 = GetCode(this);
  if (EVar1 == kNone) {
    ErrorCodeToString_abi_cxx11_(&local_50,(commissioner *)0x0,code);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    EVar1 = GetCode(this);
    ErrorCodeToString_abi_cxx11_(&local_b0,(commissioner *)(ulong)EVar1,code_00);
    std::operator+(&local_90,&local_b0,": ");
    std::operator+(&local_70,&local_90,&this->mMessage);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Error::ToString() const
{
    std::string ret;
    if (GetCode() == ErrorCode::kNone)
    {
        ret = ErrorCodeToString(ErrorCode::kNone);
    }
    else
    {
        ret = ErrorCodeToString(GetCode()) + ": " + mMessage;
    }
    return ret;
}